

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.hpp
# Opt level: O0

void __thiscall ear::ScreenEdgeLock::ScreenEdgeLock(ScreenEdgeLock *this,ScreenEdgeLock *param_1)

{
  ScreenEdgeLock *param_1_local;
  ScreenEdgeLock *this_local;
  
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::optional(&this->horizontal,&param_1->horizontal);
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::optional(&this->vertical,&param_1->vertical);
  return;
}

Assistant:

struct EAR_EXPORT ScreenEdgeLock {
    /// `screenEdgeLock` attribute on `position` element with
    /// `coordinate="azimuth"` or `coordinate="X"`
    boost::optional<std::string> horizontal;
    /// `screenEdgeLock` attribute on `position` element with
    /// `coordinate="elevation"` or `coordinate="Z"`
    boost::optional<std::string> vertical;
  }